

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_err.c
# Opt level: O3

void kvtree_err(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  char hostname [256];
  undefined8 local_1f8;
  void **local_1f0;
  undefined1 *local_1e8;
  undefined1 local_1d8 [8];
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  char local_128 [264];
  
  if (in_AL != '\0') {
    local_1a8 = in_XMM0_Qa;
    local_198 = in_XMM1_Qa;
    local_188 = in_XMM2_Qa;
    local_178 = in_XMM3_Qa;
    local_168 = in_XMM4_Qa;
    local_158 = in_XMM5_Qa;
    local_148 = in_XMM6_Qa;
    local_138 = in_XMM7_Qa;
  }
  local_1d0 = in_RSI;
  local_1c8 = in_RDX;
  local_1c0 = in_RCX;
  local_1b8 = in_R8;
  local_1b0 = in_R9;
  gethostname(local_128,0x100);
  fprintf(_stdout,"KVTree %s ERROR: %s: ","1.5.0",local_128);
  local_1f8 = 0x3000000008;
  local_1f0 = &argp[0].overflow_arg_area;
  local_1e8 = local_1d8;
  vfprintf(_stdout,fmt,&local_1f8);
  fputc(10,_stdout);
  return;
}

Assistant:

void kvtree_err(const char *fmt, ...)
{
  /* get my hostname */
  char hostname[256];
  if (gethostname(hostname, sizeof(hostname)) != 0) {
    /* TODO: error! */
  }

  va_list argp;
  fprintf(stdout, "KVTree %s ERROR: %s: ", KVTREE_VERSION, hostname);
  va_start(argp, fmt);
  vfprintf(stdout, fmt, argp);
  va_end(argp);
  fprintf(stdout, "\n");
}